

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O0

int _lws_change_pollfd(lws *wsi,int _and,int _or,lws_pollargs *pa)

{
  lws_context *context_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  lws_foreign_thread_pollfd *plVar4;
  pollfd *pfd_00;
  long lVar5;
  long lVar6;
  lws_foreign_thread_pollfd *local_68;
  lws_foreign_thread_pollfd **ftp1;
  lws_foreign_thread_pollfd *ftp;
  int tid;
  int sampled_tid;
  pollfd *pfd;
  int pa_events;
  int ret;
  lws_context *context;
  lws_context_per_thread *pt;
  lws_context_per_thread *vpt;
  lws_pollargs *pa_local;
  int _or_local;
  int _and_local;
  lws *wsi_local;
  
  pfd._4_4_ = 0;
  if (wsi == (lws *)0x0) {
    wsi_local._4_4_ = 0;
  }
  else {
    if ((wsi->position_in_fds_table != -1) && (wsi->position_in_fds_table < 0)) {
      __assert_fail("wsi->position_in_fds_table == LWS_NO_FDS_POS || wsi->position_in_fds_table >= 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/pollfd.c"
                    ,0x2c,"int _lws_change_pollfd(struct lws *, int, int, struct lws_pollargs *)");
    }
    if (wsi->position_in_fds_table == -1) {
      wsi_local._4_4_ = 0;
    }
    else if (((wsi->handling_pollout == '\0') || (_and != 0)) || (_or != 4)) {
      context_00 = wsi->context;
      lVar5 = (long)(int)wsi->tsi;
      lVar6 = lVar5 * 0x188;
      if (*(int *)((long)&context_00->set + lVar6 + -0x50) <= wsi->position_in_fds_table) {
        __assert_fail("wsi->position_in_fds_table < (int)pt->fds_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/pollfd.c"
                      ,0x49,"int _lws_change_pollfd(struct lws *, int, int, struct lws_pollargs *)")
        ;
      }
      *(undefined1 *)((long)&context_00->set + lVar6 + -0x43) = 1;
      if (*(char *)((long)&context_00->set + lVar6 + -0x44) == '\0') {
        *(undefined1 *)((long)&context_00->set + lVar6 + -0x43) = 0;
        pfd_00 = context_00->pt[lVar5].fds + wsi->position_in_fds_table;
        pa->fd = (lws_sockfd_type)wsi->desc;
        _lws_log(0x10,"%s: wsi %p: fd %d events %d -> %d\n","_lws_change_pollfd",wsi,
                 (ulong)(uint)pa->fd,(ulong)(uint)(int)pfd_00->events,
                 (int)pfd_00->events & (_and ^ 0xffffffffU) | _or);
        pa->prev_events = (int)pfd_00->events;
        uVar1 = pfd_00->events & ((ushort)_and ^ 0xffff) | (ushort)_or;
        pfd_00->events = uVar1;
        pa->events = (int)(short)uVar1;
        if ((*(ulong *)&wsi->field_0x2dc >> 1 & 1) != 0) {
          return 0;
        }
        if (context_00->event_loop_ops->io != (_func_void_lws_ptr_int *)0x0) {
          if ((_and & 1U) != 0) {
            (*context_00->event_loop_ops->io)(wsi,9);
          }
          if ((_or & 1U) != 0) {
            (*context_00->event_loop_ops->io)(wsi,5);
          }
          if ((_and & 4U) != 0) {
            (*context_00->event_loop_ops->io)(wsi,10);
          }
          if ((_or & 4U) != 0) {
            (*context_00->event_loop_ops->io)(wsi,6);
          }
        }
        if (pa->prev_events != pa->events) {
          iVar2 = lws_plat_change_pollfd(context_00,wsi,pfd_00);
          if (iVar2 == 0) {
            iVar2 = *(int *)((long)&context_00->set + lVar6 + -0x4c);
            if ((iVar2 != 0) && (wsi->vhost != (lws_vhost *)0x0)) {
              iVar3 = (*wsi->vhost->protocols->callback)
                                (wsi,LWS_CALLBACK_GET_THREAD_ID,(void *)0x0,(void *)0x0,0);
              if (iVar3 == -1) {
                pfd._4_4_ = -1;
              }
              else if (iVar3 != iVar2) {
                lws_cancel_service_pt(wsi);
              }
            }
          }
          else {
            _lws_log(8,"%s failed\n","_lws_change_pollfd");
            pfd._4_4_ = -1;
          }
        }
      }
      else {
        plVar4 = (lws_foreign_thread_pollfd *)lws_realloc((void *)0x0,0x18,"ftp");
        if (plVar4 != (lws_foreign_thread_pollfd *)0x0) {
          plVar4->_and = _and;
          plVar4->_or = _or;
          plVar4->fd_index = wsi->position_in_fds_table;
          plVar4->next = (lws_foreign_thread_pollfd *)0x0;
          for (local_68 = (lws_foreign_thread_pollfd *)&context_00->pt[lVar5].foreign_pfd_list;
              local_68->next != (lws_foreign_thread_pollfd *)0x0; local_68 = local_68->next) {
          }
          local_68->next = plVar4;
          *(undefined1 *)((long)&context_00->set + lVar6 + -0x43) = 0;
          lws_cancel_service_pt(wsi);
          return 0;
        }
        *(undefined1 *)((long)&context_00->set + lVar6 + -0x43) = 0;
        pfd._4_4_ = -1;
      }
      wsi_local._4_4_ = pfd._4_4_;
    }
    else {
      wsi->leave_pollout_active = '\x01';
      _lws_log(0x10,"%s: using leave_pollout_active\n","_lws_change_pollfd");
      wsi_local._4_4_ = 0;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
__lws_change_pollfd(struct lws *wsi, int _and, int _or)
{
	struct lws_context *context;
	struct lws_pollargs pa;
	int ret = 0;

	if (!wsi || (!wsi->protocol && !wsi->event_pipe) ||
	    wsi->position_in_fds_table == LWS_NO_FDS_POS)
		return 0;

	context = lws_get_context(wsi);
	if (!context)
		return 1;

#if defined(LWS_WITH_EXTERNAL_POLL)
	if (wsi->vhost &&
	    wsi->vhost->protocols[0].callback(wsi, LWS_CALLBACK_LOCK_POLL,
					      wsi->user_space, (void *) &pa, 0))
		return -1;
#endif

	ret = _lws_change_pollfd(wsi, _and, _or, &pa);

#if defined(LWS_WITH_EXTERNAL_POLL)
	if (wsi->vhost &&
	    wsi->vhost->protocols[0].callback(wsi, LWS_CALLBACK_UNLOCK_POLL,
					   wsi->user_space, (void *) &pa, 0))
		ret = -1;
#endif

	return ret;
}